

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O2

Entry * __thiscall
Lib::
DHMap<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
::findEntry(DHMap<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
            *this,pair<Kernel::TermSpec,_Kernel::TermSpec> *key)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Entry *pEVar4;
  uint uVar5;
  uint uVar6;
  Entry *pEVar7;
  ulong uVar8;
  
  if (this->_capacity == 0) {
    return (Entry *)0x0;
  }
  uVar2 = DefaultHash::hash<Kernel::TermSpec,Kernel::TermSpec>(key);
  uVar8 = (ulong)uVar2 % (ulong)(uint)this->_capacity;
  pEVar4 = (Entry *)0x0;
  if ((uint)this->_entries[uVar8].field_0._infoData >> 2 == this->_timestamp) {
    pEVar7 = this->_entries + uVar8;
    bVar1 = std::operator==(&pEVar7->_key,key);
    if (bVar1) {
      uVar2 = (pEVar7->field_0)._infoData & 1;
    }
    else {
      if (((pEVar7->field_0)._infoData & 2U) == 0) {
        return (Entry *)0x0;
      }
      uVar2 = DefaultHash2::hash<Kernel::TermSpec,Kernel::TermSpec>(key);
      uVar2 = uVar2 % (uint)this->_capacity;
      do {
        uVar8 = (ulong)((int)uVar8 + uVar2 + (uVar2 == 0)) % (ulong)(uint)this->_capacity;
        pEVar7 = this->_entries + uVar8;
        uVar5 = this->_entries[uVar8].field_0._infoData;
        uVar6 = uVar5 >> 2;
        uVar3 = this->_timestamp;
        if (uVar6 != uVar3) goto LAB_00482ef1;
        bVar1 = std::operator!=(&pEVar7->_key,key);
      } while (bVar1);
      uVar5 = (pEVar7->field_0)._infoData;
      uVar3 = this->_timestamp;
      uVar6 = uVar5 >> 2;
LAB_00482ef1:
      uVar2 = uVar5 & 1 | uVar6 ^ uVar3;
    }
    pEVar4 = (Entry *)0x0;
    if (uVar2 == 0) {
      pEVar4 = pEVar7;
    }
  }
  return pEVar4;
}

Assistant:

const Entry* findEntry(Key const& key) const
  {
    if (_capacity == 0) return nullptr;
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    unsigned pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }
    if(res->_key==key) {
      return res->_info.deleted ? 0 : res;
    }

    //We have a collision...

    if(!res->_info.collision) {
      //There were no collisions on this position during inserting,
      //so the key we're searching for isn't here anyway
      return 0;
    }

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);

    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }

    ASS(res->_key==key);
    return res->_info.deleted ? 0 : res;
  }